

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_newproxy(lua_State *L)

{
  GCObject *pGVar1;
  global_State *pgVar2;
  int iVar3;
  TValue *pTVar4;
  StkId pTVar5;
  int nrec;
  int iVar6;
  TValue *pTVar7;
  TValue *o2;
  
  lua_settop(L,1);
  lua_newuserdata(L,0);
  iVar3 = lua_toboolean(L,1);
  if (iVar3 != 0) {
    iVar6 = 1;
    iVar3 = lua_type(L,1);
    if (iVar3 == 1) {
      lua_createtable(L,0,nrec);
      lua_pushvalue(L,-1);
      pTVar5 = L->top;
      (pTVar5->value).b = 1;
      pTVar5->tt = 1;
      pTVar5 = L->top;
      L->top = pTVar5 + 1;
      pGVar1 = (L->ci->func->value).gc;
      pTVar7 = &luaO_nilobject_;
      if ((pGVar1->h).lsizenode != '\0') {
        pTVar7 = (TValue *)&(pGVar1->h).lastfree;
      }
      pTVar4 = luaH_set(L,&((pTVar7->value).gc)->h,pTVar5 + -1);
      pTVar4->value = pTVar5->value;
      pTVar4->tt = pTVar5->tt;
      pTVar5 = L->top;
      if ((3 < pTVar5[-1].tt) && ((((pTVar5[-1].value.gc)->gch).marked & 3) != 0)) {
        pGVar1 = (pTVar7->value).gc;
        if (((pGVar1->gch).marked & 4) != 0) {
          pgVar2 = L->l_G;
          (pGVar1->gch).marked = (pGVar1->gch).marked & 0xfb;
          (pGVar1->h).gclist = pgVar2->grayagain;
          pgVar2->grayagain = pGVar1;
          pTVar5 = L->top;
        }
      }
      L->top = pTVar5 + -2;
    }
    else {
      iVar3 = lua_getmetatable(L,iVar6);
      if (iVar3 == 0) {
LAB_00108e40:
        luaL_argerror(L,1,"boolean or proxy expected");
      }
      lua_rawget(L,-0x2713);
      iVar6 = -1;
      iVar3 = lua_toboolean(L,-1);
      L->top = L->top + -1;
      if (iVar3 == 0) goto LAB_00108e40;
      lua_getmetatable(L,iVar6);
    }
    lua_setmetatable(L,2);
  }
  return 1;
}

Assistant:

static int luaB_newproxy(lua_State*L){
lua_settop(L,1);
lua_newuserdata(L,0);
if(lua_toboolean(L,1)==0)
return 1;
else if(lua_isboolean(L,1)){
lua_newtable(L);
lua_pushvalue(L,-1);
lua_pushboolean(L,1);
lua_rawset(L,lua_upvalueindex(1));
}
else{
int validproxy=0;
if(lua_getmetatable(L,1)){
lua_rawget(L,lua_upvalueindex(1));
validproxy=lua_toboolean(L,-1);
lua_pop(L,1);
}
luaL_argcheck(L,validproxy,1,"boolean or proxy expected");
lua_getmetatable(L,1);
}
lua_setmetatable(L,2);
return 1;
}